

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::TestsupportsSubMillisecondTimestamps::TestsupportsSubMillisecondTimestamps
          (TestsupportsSubMillisecondTimestamps *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"supportsSubMillisecondTimestamps","SessionTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SessionTestCase.cpp"
             ,0x25d);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031f110;
  return;
}

Assistant:

TEST(supportsSubMillisecondTimestamps)
{
  CHECK( !Session::supportsSubSecondTimestamps(FIX::BeginString_FIX40) );
  CHECK( !Session::supportsSubSecondTimestamps(FIX::BeginString_FIX41) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIX42) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIX43) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIX44) );
  CHECK( Session::supportsSubSecondTimestamps(FIX::BeginString_FIXT11) );
}